

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int lws_h2_parser(lws *wsi,uchar *in,lws_filepos_t inlen,lws_filepos_t *inused)

{
  byte c_00;
  char cVar1;
  uint8_t uVar2;
  short sVar3;
  uint32_t uVar4;
  lws_h2_netconn *plVar5;
  lws_context *plVar6;
  char *pcVar7;
  int iVar8;
  lws_h2_protocol_send *pps_00;
  size_t sVar9;
  lws_filepos_t *plVar10;
  uchar *puVar11;
  uint uVar12;
  int local_84;
  lws_context_per_thread *pt;
  int m;
  int n;
  uchar *oldin;
  uchar c;
  lws_h2_protocol_send *pps;
  lws_h2_netconn *h2n;
  lws_filepos_t *inused_local;
  lws_filepos_t inlen_local;
  uchar *in_local;
  lws *wsi_local;
  
  plVar5 = (wsi->h2).h2n;
  plVar10 = (lws_filepos_t *)inlen;
  inlen_local = (lws_filepos_t)in;
  puVar11 = in;
  if (plVar5 != (lws_h2_netconn *)0x0) {
LAB_001417b0:
    inlen_local = (lws_filepos_t)puVar11;
    inused_local = plVar10;
    pcVar7 = preface;
    plVar10 = (lws_filepos_t *)((long)inused_local + -1);
    if (inused_local == (lws_filepos_t *)0x0) {
      *inused = inlen_local - (long)in;
      return 0;
    }
    puVar11 = (uchar *)(inlen_local + 1);
    c_00 = *(byte *)inlen_local;
    sVar3 = (short)wsi->wsistate;
    if ((sVar3 != 0x10f) && (sVar3 != 0x119)) {
      if (sVar3 == 0x20c) {
        uVar12 = plVar5->count;
        plVar5->count = uVar12 + 1;
        inlen_local = (lws_filepos_t)puVar11;
        if ((int)pcVar7[uVar12] != (uint)c_00) goto LAB_00142776;
        if (preface[plVar5->count] == '\0') {
          _lws_log(8,"http2: %p: established\n",wsi);
          lwsi_set_state(wsi,0x30d);
          lws_validity_confirmed(wsi);
          plVar5->count = 0;
          (wsi->txc).tx_cr = 0xffff;
          pps_00 = lws_h2_new_pps(LWS_H2_PPS_MY_SETTINGS);
          if (pps_00 == (lws_h2_protocol_send *)0x0) goto LAB_00142776;
          lws_pps_schedule(wsi,pps_00);
        }
        goto LAB_001417b0;
      }
      if (sVar3 != 0x30d) goto LAB_001417b0;
    }
    if (plVar5->frame_state == '\t') {
      plVar5->count = plVar5->count + 1;
      if (((plVar5->flags & 8) == 0) || ((*(ushort *)&plVar5->field_0xa8 >> 6 & 1) != 0)) {
        if (((plVar5->flags & 0x20) == 0) || ((*(ushort *)&plVar5->field_0xa8 >> 7 & 1) != 0)) {
          if ((plVar5->padding == '\0') || (plVar5->count <= plVar5->length - (uint)plVar5->padding)
             ) {
            switch(plVar5->type) {
            case '\0':
              _lws_log(8,"%s: LWS_H2_FRAME_TYPE_DATA: fl 0x%x\n","lws_h2_parser",
                       (ulong)plVar5->flags);
              if (wsi->immortal_substream_count == '\0') {
                if (wsi->vhost->keepalive_timeout == 0) {
                  local_84 = 0x1f;
                }
                else {
                  local_84 = wsi->vhost->keepalive_timeout;
                }
                lws_set_timeout(wsi,PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,local_84);
              }
              if (plVar5->swsi != (lws *)0x0) {
                sVar9 = lws_buflist_next_segment_len(&plVar5->swsi->buflist,(uint8_t **)0x0);
                if (sVar9 != 0) {
                  _lws_log(8,"%s: substream has pending\n","lws_h2_parser");
                }
                if (((plVar5->swsi->role_ops == &role_ops_h1) ||
                    (plVar5->swsi->role_ops == &role_ops_h2)) &&
                   ((plVar5->swsi->wsistate & 0xffff) == 0x119)) {
                  lwsi_set_state(plVar5->swsi,0x17);
                  _lws_log(8,"%s: swsi %p to LRS_BODY\n","lws_h2_parser",plVar5->swsi);
                }
                iVar8 = lws_hdr_total_length(plVar5->swsi,WSI_TOKEN_HTTP_CONTENT_LENGTH);
                if (((iVar8 == 0) || ((plVar5->swsi->http).rx_content_length == 0)) ||
                   ((inused_local <= (lws_filepos_t *)(plVar5->swsi->http).rx_content_remain ||
                    (plVar5->length <= plVar5->inside)))) {
                  pt._4_4_ = (int)plVar10 + 1;
                  if ((int)((plVar5->length - plVar5->count) + 1) < (int)pt._4_4_) {
                    pt._4_4_ = (plVar5->length - plVar5->count) + 1;
                    _lws_log(0x10,"---- restricting len to %d vs %ld\n",(ulong)pt._4_4_,inused_local
                            );
                  }
                  if ((*(ulong *)&plVar5->swsi->field_0x2dc >> 0x37 & 1) == 0) {
                    if ((plVar5->swsi->wsistate & 0xffff) == 0x110) {
                      iVar8 = lws_buflist_append_segment
                                        (&plVar5->swsi->buflist,(uint8_t *)inlen_local,
                                         (long)(int)pt._4_4_);
                      if (iVar8 < 0) {
                        return -1;
                      }
                      if (iVar8 != 0) {
                        plVar6 = wsi->context;
                        cVar1 = wsi->tsi;
                        _lws_log(0x10,"%s: added %p to rxflow list\n","lws_h2_parser",wsi);
                        lws_dll2_add_head(&plVar5->swsi->dll_buflist,
                                          &plVar6->pt[(int)cVar1].dll_buflist_owner);
                      }
                      plVar5->inside = pt._4_4_ + plVar5->inside;
                      plVar5->count = (pt._4_4_ - 1) + plVar5->count;
                      _lws_log(0x10,"%s: deferred %d\n","lws_h2_parser",(ulong)pt._4_4_);
                    }
                    else {
                      *(ulong *)&plVar5->swsi->field_0x2dc =
                           *(ulong *)&plVar5->swsi->field_0x2dc & 0xfffff7ffffffffff | 0x80000000000
                      ;
                      pt._4_4_ = lws_read_h1(plVar5->swsi,(uchar *)inlen_local,(long)(int)pt._4_4_);
                      *(ulong *)&plVar5->swsi->field_0x2dc =
                           *(ulong *)&plVar5->swsi->field_0x2dc & 0xfffff7ffffffffff;
                      if (((int)pt._4_4_ < 0) ||
                         ((pt._4_4_ == 0 &&
                          (sVar9 = lws_buflist_next_segment_len(&wsi->buflist,(uint8_t **)0x0),
                          sVar9 == 0)))) {
                        _lws_log(8,"%s: lws_read_h1 told %d %u / %u\n","lws_h2_parser",
                                 (ulong)pt._4_4_,(ulong)plVar5->count,(ulong)plVar5->length);
                        inlen_local = (long)puVar11 + (ulong)(plVar5->length - plVar5->count);
                        plVar5->inside = plVar5->length;
                        plVar5->count = plVar5->length - 1;
                        goto LAB_0014271a;
                      }
                      plVar5->inside = pt._4_4_ + plVar5->inside;
                      plVar5->count = (pt._4_4_ - 1) + plVar5->count;
                      (plVar5->swsi->txc).peer_tx_cr_est =
                           (plVar5->swsi->txc).peer_tx_cr_est - pt._4_4_;
                      (wsi->txc).peer_tx_cr_est = (wsi->txc).peer_tx_cr_est - pt._4_4_;
                    }
                    inlen_local = (long)puVar11 + (long)(int)(pt._4_4_ - 1);
                    inused_local = (lws_filepos_t *)((long)plVar10 - (long)(int)(pt._4_4_ - 1));
                    plVar10 = inused_local;
                    puVar11 = (uchar *)inlen_local;
                    if ((plVar5->swsi->flags & 0x200U) == 0) {
                      lws_h2_update_peer_txcredit_thresh(plVar5->swsi,plVar5->sid,pt._4_4_,pt._4_4_)
                      ;
                    }
                    else {
                      lws_h2_update_peer_txcredit(wsi,0,pt._4_4_);
                      (plVar5->swsi->txc).manual = '\x01';
                    }
                  }
                  else {
                    if (plVar5->swsi->protocol == (lws_protocols *)0x0) {
                      _lws_log(1,"%s: swsi %p doesn\'t have protocol\n","lws_h2_parser",plVar5->swsi
                              );
                      pt._0_4_ = 1;
                    }
                    else {
                      (plVar5->swsi->txc).peer_tx_cr_est =
                           (plVar5->swsi->txc).peer_tx_cr_est - pt._4_4_;
                      (wsi->txc).peer_tx_cr_est = (wsi->txc).peer_tx_cr_est - pt._4_4_;
                      lws_wsi_txc_describe
                                (&plVar5->swsi->txc,"lws_h2_parser",(plVar5->swsi->mux).my_sid);
                      pt._0_4_ = user_callback_handle_rxflow
                                           (plVar5->swsi->protocol->callback,plVar5->swsi,
                                            LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,
                                            plVar5->swsi->user_space,(void *)inlen_local,
                                            (long)(int)pt._4_4_);
                    }
                    inlen_local = (long)puVar11 + (long)(int)(pt._4_4_ - 1);
                    plVar5->inside = pt._4_4_ + plVar5->inside;
                    plVar5->count = (pt._4_4_ - 1) + plVar5->count;
                    plVar10 = (lws_filepos_t *)((long)plVar10 - (long)(int)(pt._4_4_ - 1));
                    puVar11 = (uchar *)inlen_local;
                    if ((int)pt != 0) {
                      _lws_log(8,"RECEIVE_CLIENT_HTTP closed it\n");
LAB_0014271a:
                      lws_close_free_wsi(plVar5->swsi,LWS_CLOSE_STATUS_NOSTATUS,
                                         "close_swsi_and_return");
                      plVar5->swsi = (lws *)0x0;
                      plVar5->frame_state = '\0';
                      plVar5->count = 0;
                      *inused = inlen_local - (long)in;
                      return 2;
                    }
                  }
                }
                else {
                  lws_h2_goaway(wsi,1,"More rx than content_length told");
                }
              }
              break;
            case '\x01':
            case '\t':
              if ((plVar5->swsi != (lws *)0x0) &&
                 (iVar8 = lws_hpack_interpret(plVar5->swsi,c_00), iVar8 != 0)) {
                _lws_log(8,"%s: hpack failed\n","lws_h2_parser");
                inlen_local = (lws_filepos_t)puVar11;
                goto LAB_00142776;
              }
              break;
            case '\x02':
              if (plVar5->count < 5) {
                plVar5->dep = plVar5->dep << 8;
                plVar5->dep = (uint)c_00 | plVar5->dep;
              }
              else {
                plVar5->weight_temp = c_00;
                _lws_log(8,"PRIORITY: dep 0x%x, weight 0x%02X\n",(ulong)plVar5->dep,
                         (ulong)plVar5->weight_temp);
                if ((plVar5->dep & 0x7fffffff) == plVar5->sid) {
                  lws_h2_goaway(wsi,1,"cant depend on own sid");
                }
              }
              break;
            case '\x03':
              plVar5->hpack_e_dep = plVar5->hpack_e_dep << 8;
              plVar5->hpack_e_dep = (uint)c_00 | plVar5->hpack_e_dep;
              break;
            case '\x04':
              uVar12 = ((plVar5->count - 1) - plVar5->preamble) % 6;
              plVar5->one_setting[(int)uVar12] = c_00;
              if (uVar12 == 5) {
                lws_h2_settings(wsi,&plVar5->peer_set,plVar5->one_setting,6);
              }
              break;
            case '\x05':
              break;
            case '\x06':
              if ((plVar5->flags & 1) == 0) {
                if (8 < plVar5->count) {
                  return 1;
                }
                plVar5->ping_payload[plVar5->count - 1] = c_00;
              }
              break;
            case '\a':
              uVar12 = plVar5->inside;
              plVar5->inside = uVar12 + 1;
              if (uVar12 < 4) {
                plVar5->goaway_last_sid = plVar5->goaway_last_sid << 8;
                plVar5->goaway_last_sid = (uint)c_00 | plVar5->goaway_last_sid;
                plVar5->goaway_str[0] = '\0';
              }
              else if (uVar12 - 4 < 4) {
                plVar5->goaway_err = plVar5->goaway_err << 8;
                plVar5->goaway_err = (uint)c_00 | plVar5->goaway_err;
              }
              else {
                if (plVar5->inside - 9 < 0x1f) {
                  plVar5->goaway_str[plVar5->inside - 9] = c_00;
                }
                plVar5->goaway_str[0x1f] = '\0';
              }
              break;
            case '\b':
              plVar5->hpack_e_dep = plVar5->hpack_e_dep << 8;
              plVar5->hpack_e_dep = (uint)c_00 | plVar5->hpack_e_dep;
              break;
            case '\n':
              break;
            default:
              _lws_log(4,"%s: unhandled frame type %d\n","lws_h2_parser",(ulong)plVar5->type);
              inlen_local = (lws_filepos_t)puVar11;
              goto LAB_00142776;
            }
          }
          else if (c_00 != 0) {
            lws_h2_goaway(wsi,1,"nonzero padding");
            goto LAB_001417b0;
          }
          inlen_local = (lws_filepos_t)puVar11;
          inused_local = plVar10;
          if (plVar5->length < plVar5->count) {
            _lws_log(4,"%s: count > length %u %u\n","lws_h2_parser",(ulong)plVar5->count,
                     (ulong)plVar5->length);
            goto LAB_00142776;
          }
          plVar10 = inused_local;
          puVar11 = (uchar *)inlen_local;
          if ((plVar5->count == plVar5->length) &&
             (iVar8 = lws_h2_parse_end_of_frame(wsi), iVar8 != 0)) goto LAB_00142776;
          goto LAB_001417b0;
        }
        _lws_log(0x10,"PRIORITY FLAG:  0x%x\n",(ulong)c_00);
        uVar4 = plVar5->preamble;
        plVar5->preamble = uVar4 + 1;
        if (uVar4 - (*(ushort *)&plVar5->field_0xa8 >> 6 & 1) < 4) {
          plVar5->dep = plVar5->dep << 8 | (uint)c_00;
        }
        else {
          plVar5->weight_temp = c_00;
          *(ushort *)&plVar5->field_0xa8 = *(ushort *)&plVar5->field_0xa8 & 0xff7f | 0x80;
          _lws_log(0x10,"PRI FL: dep 0x%x, weight 0x%02X\n",(ulong)plVar5->dep,
                   (ulong)plVar5->weight_temp);
        }
      }
      else {
        plVar5->padding = c_00;
        *(ushort *)&plVar5->field_0xa8 = *(ushort *)&plVar5->field_0xa8 & 0xffbf | 0x40;
        plVar5->preamble = plVar5->preamble + 1;
        if (plVar5->length - 1 < (uint)plVar5->padding) {
          lws_h2_goaway(wsi,1,"execssive padding");
        }
      }
      goto LAB_001417b0;
    }
    if (plVar5->frame_state < 9) {
      uVar2 = plVar5->frame_state;
      plVar5->frame_state = uVar2 + '\x01';
      switch(uVar2) {
      case '\0':
        *(ushort *)&plVar5->field_0xa8 = *(ushort *)&plVar5->field_0xa8 & 0xffbf;
        *(ushort *)&plVar5->field_0xa8 = *(ushort *)&plVar5->field_0xa8 & 0xff7f;
        plVar5->padding = '\0';
        plVar5->preamble = 0;
        plVar5->length = (uint)c_00;
        plVar5->inside = 0;
        break;
      case '\x01':
      case '\x02':
        plVar5->length = plVar5->length << 8;
        plVar5->length = (uint)c_00 | plVar5->length;
        break;
      case '\x03':
        plVar5->type = c_00;
        break;
      case '\x04':
        plVar5->flags = c_00;
        break;
      case '\x05':
      case '\x06':
      case '\a':
      case '\b':
        plVar5->sid = plVar5->sid << 8;
        plVar5->sid = (uint)c_00 | plVar5->sid;
      }
    }
    if ((plVar5->frame_state != '\t') ||
       (iVar8 = lws_h2_parse_frame_header(wsi), inlen_local = (lws_filepos_t)puVar11, iVar8 == 0))
    goto LAB_001417b0;
  }
LAB_00142776:
  *inused = inlen_local - (long)in;
  return 1;
}

Assistant:

int
lws_h2_parser(struct lws *wsi, unsigned char *in, lws_filepos_t inlen,
	      lws_filepos_t *inused)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws_h2_protocol_send *pps;
	unsigned char c, *oldin = in;
	int n, m;

	if (!h2n)
		goto fail;

	while (inlen--) {

		c = *in++;

		// lwsl_notice("%s: 0x%x\n", __func__, c);

		switch (lwsi_state(wsi)) {
		case LRS_H2_AWAIT_PREFACE:
			if (preface[h2n->count++] != c)
				goto fail;

			if (preface[h2n->count])
				break;

			lwsl_info("http2: %p: established\n", wsi);
			lwsi_set_state(wsi, LRS_H2_AWAIT_SETTINGS);
			lws_validity_confirmed(wsi);
			h2n->count = 0;
			wsi->txc.tx_cr = 65535;

			/*
			 * we must send a settings frame -- empty one is OK...
			 * that must be the first thing sent by server
			 * and the peer must send a SETTINGS with ACK flag...
			 */
			pps = lws_h2_new_pps(LWS_H2_PPS_MY_SETTINGS);
			if (!pps)
				goto fail;
			lws_pps_schedule(wsi, pps);
			break;

		case LRS_H2_WAITING_TO_SEND_HEADERS:
		case LRS_ESTABLISHED:
		case LRS_H2_AWAIT_SETTINGS:
			if (h2n->frame_state != LWS_H2_FRAME_HEADER_LENGTH)
				goto try_frame_start;

			/*
			 * post-header, preamble / payload / padding part
			 */
			h2n->count++;

			if (h2n->flags & LWS_H2_FLAG_PADDED &&
			    !h2n->pad_length) {
				/*
				 * Get the padding count... actual padding is
				 * at the end of the frame.
				 */
				h2n->padding = c;
				h2n->pad_length = 1;
				h2n->preamble++;

				if (h2n->padding > h2n->length - 1)
					lws_h2_goaway(wsi,
						      H2_ERR_PROTOCOL_ERROR,
						      "execssive padding");
				break; /* we consumed this */
			}

			if (h2n->flags & LWS_H2_FLAG_PRIORITY &&
			    !h2n->collected_priority) {
				/* going to be 5 preamble bytes */

				lwsl_debug("PRIORITY FLAG:  0x%x\n", c);

				if (h2n->preamble++ - h2n->pad_length < 4) {
					h2n->dep = ((h2n->dep) << 8) | c;
					break; /* we consumed this */
				}
				h2n->weight_temp = c;
				h2n->collected_priority = 1;
				lwsl_debug("PRI FL: dep 0x%x, weight 0x%02X\n",
					   (unsigned int)h2n->dep,
					   h2n->weight_temp);
				break; /* we consumed this */
			}
			if (h2n->padding && h2n->count >
			    (h2n->length - h2n->padding)) {
				if (c) {
					lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
						      "nonzero padding");
					break;
				}
				goto frame_end;
			}

			/* applies to wsi->h2.swsi which may be wsi */
			switch(h2n->type) {

			case LWS_H2_FRAME_TYPE_SETTINGS:
				n = (h2n->count - 1 - h2n->preamble) %
				     LWS_H2_SETTINGS_LEN;
				h2n->one_setting[n] = c;
				if (n != LWS_H2_SETTINGS_LEN - 1)
					break;
				lws_h2_settings(wsi, &h2n->peer_set,
						h2n->one_setting,
						LWS_H2_SETTINGS_LEN);
				break;

			case LWS_H2_FRAME_TYPE_CONTINUATION:
			case LWS_H2_FRAME_TYPE_HEADERS:
				if (!h2n->swsi)
					break;
				if (lws_hpack_interpret(h2n->swsi, c)) {
					lwsl_info("%s: hpack failed\n",
						  __func__);
					goto fail;
				}
				break;

			case LWS_H2_FRAME_TYPE_GOAWAY:
				switch (h2n->inside++) {
				case 0:
				case 1:
				case 2:
				case 3:
					h2n->goaway_last_sid <<= 8;
					h2n->goaway_last_sid |= c;
					h2n->goaway_str[0] = '\0';
					break;

				case 4:
				case 5:
				case 6:
				case 7:
					h2n->goaway_err <<= 8;
					h2n->goaway_err |= c;
					break;

				default:
					if (h2n->inside - 9 <
					    sizeof(h2n->goaway_str) - 1)
						h2n->goaway_str[
						           h2n->inside - 9] = c;
					h2n->goaway_str[
					    sizeof(h2n->goaway_str) - 1] = '\0';
					break;
				}
				break;

			case LWS_H2_FRAME_TYPE_DATA:

				lwsl_info("%s: LWS_H2_FRAME_TYPE_DATA: fl 0x%x\n",
					  __func__, h2n->flags);

				/*
				 * let the network wsi live a bit longer if
				 * subs are active... our frame may take a long
				 * time to chew through
				 */
				if (!wsi->immortal_substream_count)
					lws_set_timeout(wsi,
					PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,
						wsi->vhost->keepalive_timeout ?
					    wsi->vhost->keepalive_timeout : 31);

				if (!h2n->swsi)
					break;

				if (lws_buflist_next_segment_len(
						&h2n->swsi->buflist, NULL))
					lwsl_info("%s: substream has pending\n",
						  __func__);

				if (lwsi_role_http(h2n->swsi) &&
				    lwsi_state(h2n->swsi) == LRS_ESTABLISHED) {
					lwsi_set_state(h2n->swsi, LRS_BODY);
					lwsl_info("%s: swsi %p to LRS_BODY\n",
							__func__, h2n->swsi);
				}

				if (lws_hdr_total_length(h2n->swsi,
					     WSI_TOKEN_HTTP_CONTENT_LENGTH) &&
				    h2n->swsi->http.rx_content_length &&
				    h2n->swsi->http.rx_content_remain <
						    inlen + 1 && /* last */
				    h2n->inside < h2n->length) {
					/* unread data in frame */
					lws_h2_goaway(wsi,
						      H2_ERR_PROTOCOL_ERROR,
					    "More rx than content_length told");
					break;
				}

				/*
				 * We operate on a frame.  The RX we have at
				 * hand may exceed the current frame.
				 */

				n = (int)inlen + 1;
				if (n > (int)(h2n->length - h2n->count + 1)) {
					n = h2n->length - h2n->count + 1;
					lwsl_debug("---- restricting len to %d "
						   "vs %ld\n", n, (long)inlen + 1);
				}
#if defined(LWS_WITH_CLIENT)
				if (h2n->swsi->client_mux_substream) {
					if (!h2n->swsi->protocol) {
						lwsl_err("%s: swsi %p doesn't have protocol\n",
							 __func__, h2n->swsi);
						m = 1;
					} else {
						h2n->swsi->txc.peer_tx_cr_est -= n;
						wsi->txc.peer_tx_cr_est -= n;
						lws_wsi_txc_describe(&h2n->swsi->txc,
							__func__,
							h2n->swsi->mux.my_sid);
					m = user_callback_handle_rxflow(
						h2n->swsi->protocol->callback,
						h2n->swsi,
					  LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,
						h2n->swsi->user_space,
						in - 1, n);
					}

					in += n - 1;
					h2n->inside += n;
					h2n->count += n - 1;
					inlen -= n - 1;

					if (m) {
						lwsl_info("RECEIVE_CLIENT_HTTP "
							  "closed it\n");
						goto close_swsi_and_return;
					}

					break;
				}
#endif

				if (lwsi_state(h2n->swsi) == LRS_DEFERRING_ACTION) {
					m = lws_buflist_append_segment(
						&h2n->swsi->buflist, in - 1, n);
					if (m < 0)
						return -1;
					if (m) {
						struct lws_context_per_thread *pt;

						pt = &wsi->context->pt[(int)wsi->tsi];
						lwsl_debug("%s: added %p to rxflow list\n",
							   __func__, wsi);
						lws_dll2_add_head(
							&h2n->swsi->dll_buflist,
							&pt->dll_buflist_owner);
					}
					in += n - 1;
					h2n->inside += n;
					h2n->count += n - 1;
					inlen -= n - 1;

					lwsl_debug("%s: deferred %d\n", __func__, n);
					goto do_windows;
				}

				h2n->swsi->outer_will_close = 1;
				/*
				 * choose the length for this go so that we end at
				 * the frame boundary, in the case there is already
				 * more waiting leave it for next time around
				 */

				n = lws_read_h1(h2n->swsi, in - 1, n);
				// lwsl_notice("%s: lws_read_h1 %d\n", __func__, n);
				h2n->swsi->outer_will_close = 0;
				/*
				 * can return 0 in POST body with
				 * content len exhausted somehow.
				 */
				if (n < 0 ||
				    (!n && !lws_buflist_next_segment_len(
						    &wsi->buflist, NULL))) {
					lwsl_info("%s: lws_read_h1 told %d %u / %u\n",
						__func__, n,
						(unsigned int)h2n->count,
						(unsigned int)h2n->length);
					in += h2n->length - h2n->count;
					h2n->inside = h2n->length;
					h2n->count = h2n->length - 1;

					//if (n < 0)
					//	goto already_closed_swsi;
					goto close_swsi_and_return;
				}

				inlen -= n - 1;
				in += n - 1;
				h2n->inside += n;
				h2n->count += n - 1;
				h2n->swsi->txc.peer_tx_cr_est -= n;
				wsi->txc.peer_tx_cr_est -= n;

do_windows:

#if defined(LWS_WITH_CLIENT)
				if (!(h2n->swsi->flags & LCCSCF_H2_MANUAL_RXFLOW))
#endif
				{
					/*
					 * The default behaviour is we just keep
					 * cranking the other side's tx credit
					 * back up, for simple bulk transfer as
					 * fast as we can take it
					 */

					m = n; //(2 * h2n->length) + 65536;

					/* update both the stream and nwsi */

					lws_h2_update_peer_txcredit_thresh(h2n->swsi,
								    h2n->sid, m, m);
				}
#if defined(LWS_WITH_CLIENT)
				else {
					/*
					 * If he's handling it himself, only
					 * repair the nwsi credit but allow the
					 * stream credit to run down until the
					 * user code deals with it
					 */
					lws_h2_update_peer_txcredit(wsi, 0, n);
					h2n->swsi->txc.manual = 1;
				}
#endif
				break;

			case LWS_H2_FRAME_TYPE_PRIORITY:
				if (h2n->count <= 4) {
					h2n->dep <<= 8;
					h2n->dep |= c;
					break;
				}
				h2n->weight_temp = c;
				lwsl_info("PRIORITY: dep 0x%x, weight 0x%02X\n",
					  (unsigned int)h2n->dep, h2n->weight_temp);

				if ((h2n->dep & ~(1u << 31)) == h2n->sid) {
					lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
						      "cant depend on own sid");
					break;
				}
				break;

			case LWS_H2_FRAME_TYPE_RST_STREAM:
				h2n->hpack_e_dep <<= 8;
				h2n->hpack_e_dep |= c;
				break;

			case LWS_H2_FRAME_TYPE_PUSH_PROMISE:
				break;

			case LWS_H2_FRAME_TYPE_PING:
				if (h2n->flags & LWS_H2_FLAG_SETTINGS_ACK) { // ack
				} else { /* they're sending us a ping request */
					if (h2n->count > 8)
						return 1;
					h2n->ping_payload[h2n->count - 1] = c;
				}
				break;

			case LWS_H2_FRAME_TYPE_WINDOW_UPDATE:
				h2n->hpack_e_dep <<= 8;
				h2n->hpack_e_dep |= c;
				break;

			case LWS_H2_FRAME_TYPE_COUNT: /* IGNORING FRAME */
				break;

			default:
				lwsl_notice("%s: unhandled frame type %d\n",
					    __func__, h2n->type);

				goto fail;
			}

frame_end:
			if (h2n->count > h2n->length) {
				lwsl_notice("%s: count > length %u %u\n",
					    __func__, (unsigned int)h2n->count,
					    (unsigned int)h2n->length);
				goto fail;
			}
			if (h2n->count != h2n->length)
				break;

			/*
			 * end of frame just happened
			 */
			if (lws_h2_parse_end_of_frame(wsi))
				goto fail;

			break;

try_frame_start:
			if (h2n->frame_state <= 8) {

				switch (h2n->frame_state++) {
				case 0:
					h2n->pad_length = 0;
					h2n->collected_priority = 0;
					h2n->padding = 0;
					h2n->preamble = 0;
					h2n->length = c;
					h2n->inside = 0;
					break;
				case 1:
				case 2:
					h2n->length <<= 8;
					h2n->length |= c;
					break;
				case 3:
					h2n->type = c;
					break;
				case 4:
					h2n->flags = c;
					break;

				case 5:
				case 6:
				case 7:
				case 8:
					h2n->sid <<= 8;
					h2n->sid |= c;
					break;
				}
			}

			if (h2n->frame_state == LWS_H2_FRAME_HEADER_LENGTH)
				if (lws_h2_parse_frame_header(wsi))
					goto fail;
			break;

		default:
			break;
		}
	}

	*inused = in - oldin;

	return 0;

close_swsi_and_return:

	lws_close_free_wsi(h2n->swsi, 0, "close_swsi_and_return");
	h2n->swsi = NULL;
	h2n->frame_state = 0;
	h2n->count = 0;

// already_closed_swsi:
	*inused = in - oldin;

	return 2;

fail:
	*inused = in - oldin;

	return 1;
}

#if defined(LWS_WITH_CLIENT)
int
lws_h2_client_handshake(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	uint8_t *buf, *start, *p, *p1, *end;
	char *meth = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_METHOD),
	     *uri = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_URI);
	struct lws *nwsi = lws_get_network_wsi(wsi);
	int n, m;
	/*
	 * The identifier of a newly established stream MUST be numerically
	 * greater than all streams that the initiating endpoint has opened or
	 * reserved.  This governs streams that are opened using a HEADERS frame
	 * and streams that are reserved using PUSH_PROMISE.  An endpoint that
	 * receives an unexpected stream identifier MUST respond with a
	 * connection error (Section 5.4.1) of type PROTOCOL_ERROR.
	 */
	int sid = nwsi->h2.h2n->highest_sid_opened + 2;

	lwsl_debug("%s\n", __func__);

	nwsi->h2.h2n->highest_sid_opened = sid;
	wsi->mux.my_sid = sid;

	lwsl_info("%s: CLIENT_WAITING_TO_SEND_HEADERS: pollout (sid %d)\n",
			__func__, wsi->mux.my_sid);

	p = start = buf = pt->serv_buf + LWS_PRE;
	end = start + (wsi->context->pt_serv_buf_size / 2) - LWS_PRE - 1;

	/* it's time for us to send our client stream headers */

	if (!meth)
		meth = "GET";

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_METHOD,
				(unsigned char *)meth,
				(int)strlen(meth), &p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_SCHEME,
				(unsigned char *)"https", 5,
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_PATH,
				(unsigned char *)uri,
				lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_URI),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_AUTHORITY,
				(unsigned char *)lws_hdr_simple_ptr(wsi,
						_WSI_TOKEN_CLIENT_ORIGIN),
			lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_ORIGIN),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HOST,
				(unsigned char *)lws_hdr_simple_ptr(wsi,
						_WSI_TOKEN_CLIENT_HOST),
			lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_HOST),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_USER_AGENT,
				(unsigned char *)"lwsss", 5,
				&p, end))
		goto fail_length;

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME) {
		p1 = lws_http_multipart_headers(wsi, p);
		if (!p1)
			goto fail_length;
		p = p1;
	}

	if (wsi->flags & LCCSCF_HTTP_X_WWW_FORM_URLENCODED) {
		if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE,
			   (unsigned char *)"application/x-www-form-urlencoded",
			   33, &p, end))
			goto fail_length;
		lws_client_http_body_pending(wsi, 1);
	}

	/* give userland a chance to append, eg, cookies */

	if (wsi->protocol->callback(wsi,
				LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER,
				wsi->user_space, &p, (end - p) - 12))
		goto fail_length;

	if (lws_finalize_http_header(wsi, &p, end))
		goto fail_length;

#if defined(LWS_WITH_DETAILED_LATENCY)
	wsi->detlat.earliest_write_req_pre_write = lws_now_usecs();
#endif

	m = LWS_WRITE_HTTP_HEADERS;
#if defined(LWS_WITH_CLIENT)
	/* below is not needed in spec, indeed it destroys the long poll
	 * feature, but required by nghttp2 */
	if ((wsi->flags & LCCSCF_H2_QUIRK_NGHTTP2_END_STREAM) &&
	    !(wsi->client_http_body_pending))
		m |= LWS_WRITE_H2_STREAM_END;
#endif

	// lwsl_hexdump_notice(start, p - start);

	n = lws_write(wsi, start, p - start, m);

	if (n != (p - start)) {
		lwsl_err("_write returned %d from %ld\n", n,
			 (long)(p - start));
		return -1;
	}

	/*
	 * Normally let's charge up the peer tx credit a bit.  But if
	 * MANUAL_REFLOW is set, just set it to the initial credit given in
	 * the client create info
	 */

	n = 4 * 65536;
	if (wsi->flags & LCCSCF_H2_MANUAL_RXFLOW) {
		n = wsi->txc.manual_initial_tx_credit;
		wsi->txc.manual = 1;
	}

	if (lws_h2_update_peer_txcredit(wsi, sid, n))
		return 1;

	lws_h2_state(wsi, LWS_H2_STATE_OPEN);
	lwsi_set_state(wsi, LRS_ESTABLISHED);

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME)
		lws_callback_on_writable(wsi);

	return 0;

fail_length:
	lwsl_err("Client hdrs too long: incr context info.pt_serv_buf_size\n");

	return -1;
}
#endif

int
lws_h2_ws_handshake(struct lws *wsi)
{
	uint8_t buf[LWS_PRE + 2048], *p = buf + LWS_PRE, *start = p,
		*end = &buf[sizeof(buf) - 1];
	const struct lws_http_mount *hit;
	const char * uri_ptr;
	int n, m;

	if (lws_add_http_header_status(wsi, HTTP_STATUS_OK, &p, end))
		return -1;

	if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) > 64)
		return -1;

	if (wsi->proxied_ws_parent && wsi->child_list) {
		if (lws_hdr_simple_ptr(wsi, WSI_TOKEN_PROTOCOL)) {
			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(uint8_t *)lws_hdr_simple_ptr(wsi,
							   WSI_TOKEN_PROTOCOL),
				(int)strlen(lws_hdr_simple_ptr(wsi,
							   WSI_TOKEN_PROTOCOL)),
						 &p, end))
			return -1;
		}
	} else {

		/* we can only return the protocol header if:
		 *  - one came in, and ... */
		if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) &&
		    /*  - it is not an empty string */
		    wsi->protocol->name && wsi->protocol->name[0]) {
			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(unsigned char *)wsi->protocol->name,
				(int)strlen(wsi->protocol->name), &p, end))
			return -1;
		}
	}

	if (lws_finalize_http_header(wsi, &p, end))
		return -1;

	m = lws_ptr_diff(p, start);
	// lwsl_hexdump_notice(start, m);
	n = lws_write(wsi, start, m, LWS_WRITE_HTTP_HEADERS);
	if (n != m) {
		lwsl_err("_write returned %d from %d\n", n, m);

		return -1;
	}

	/*
	 * alright clean up, set our state to generic ws established, the
	 * mode / state of the nwsi will get the h2 processing done.
	 */

	lwsi_set_state(wsi, LRS_ESTABLISHED);
	wsi->lws_rx_parse_state = 0; // ==LWS_RXPS_NEW;

	uri_ptr = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_COLON_PATH);
	n = lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COLON_PATH);
	hit = lws_find_mount(wsi, uri_ptr, n);

	if (hit && hit->cgienv &&
	    wsi->protocol->callback(wsi, LWS_CALLBACK_HTTP_PMO, wsi->user_space,
				    (void *)hit->cgienv, 0))
		return 1;

	lws_validity_confirmed(wsi);

	return 0;
}

int
lws_read_h2(struct lws *wsi, unsigned char *buf, lws_filepos_t len)
{
	unsigned char *oldbuf = buf;
	lws_filepos_t body_chunk_len;

	// lwsl_notice("%s: h2 path: wsistate 0x%x len %d\n", __func__,
	//		wsi->wsistate, (int)len);

	/*
	 * wsi here is always the network connection wsi, not a stream
	 * wsi.  Once we unpicked the framing we will find the right
	 * swsi and make it the target of the frame.
	 *
	 * If it's ws over h2, the nwsi will get us here to do the h2
	 * processing, and that will call us back with the swsi +
	 * ESTABLISHED state for the inner payload, handled in a later
	 * case.
	 */
	while (len) {
		int m;

		/*
		 * we were accepting input but now we stopped doing so
		 */
		if (lws_is_flowcontrolled(wsi)) {
			lws_rxflow_cache(wsi, buf, 0, (int)len);
			buf += len;
			break;
		}

		/*
		 * lws_h2_parser() may send something; when it gets the
		 * whole frame, it will want to perform some action
		 * involving a reply.  But we may be in a partial send
		 * situation on the network wsi...
		 *
		 * Even though we may be in a partial send and unable to
		 * send anything new, we still have to parse the network
		 * wsi in order to gain tx credit to send, which is
		 * potentially necessary to clear the old partial send.
		 *
		 * ALL network wsi-specific frames are sent by PPS
		 * already, these are sent as a priority on the writable
		 * handler, and so respect partial sends.  The only
		 * problem is when a stream wsi wants to send an, eg,
		 * reply headers frame in response to the parsing
		 * we will do now... the *stream wsi* must stall in a
		 * different state until it is able to do so from a
		 * priority on the WRITABLE callback, same way that
		 * file transfers operate.
		 */

		m = lws_h2_parser(wsi, buf, len, &body_chunk_len);
		if (m && m != 2) {
			lwsl_debug("%s: http2_parser bail: %d\n", __func__, m);
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "lws_read_h2 bail");

			return -1;
		}
		if (m == 2) {
			/* swsi has been closed */
			buf += body_chunk_len;
			break;
		}

		buf += body_chunk_len;
		len -= body_chunk_len;
	}

	return lws_ptr_diff(buf, oldbuf);
}

int
lws_h2_client_stream_long_poll_rxonly(struct lws *wsi)
{

	if (!wsi->mux_substream)
		return 1;

	/*
	 * Elect to send an empty DATA with END_STREAM, to force the stream
	 * into HALF_CLOSED LOCAL
	 */
	wsi->h2.long_poll = 1;
	wsi->h2.send_END_STREAM = 1;

	// lws_header_table_detach(wsi, 0);

	lws_callback_on_writable(wsi);

	return 0;
}